

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O1

CURLcode Curl_hsts_loadfile(Curl_easy *data,hsts *h,char *file)

{
  char cVar1;
  int iVar2;
  CURLcode CVar3;
  char *pcVar4;
  FILE *__stream;
  size_t sVar5;
  long expires;
  stsentry *psVar6;
  dynbuf buf;
  char date [65];
  char host [257];
  dynbuf local_1a8;
  long local_188;
  short local_180;
  char local_138 [264];
  
  (*Curl_cfree)(h->filename);
  pcVar4 = (*Curl_cstrdup)(file);
  h->filename = pcVar4;
  if (pcVar4 == (char *)0x0) {
    CVar3 = CURLE_OUT_OF_MEMORY;
  }
  else {
    __stream = fopen64(file,"r");
    CVar3 = CURLE_OK;
    if (__stream != (FILE *)0x0) {
      Curl_dyn_init(&local_1a8,0xfff);
      iVar2 = Curl_get_line(&local_1a8,(FILE *)__stream);
      if (iVar2 != 0) {
        do {
          pcVar4 = Curl_dyn_ptr(&local_1a8);
          while( true ) {
            cVar1 = *pcVar4;
            if ((cVar1 != '\t') && (cVar1 != ' ')) break;
            pcVar4 = pcVar4 + 1;
          }
          if (cVar1 != '#') {
            sVar5 = strlen(pcVar4);
            if (1 < sVar5) {
              iVar2 = __isoc99_sscanf(pcVar4,"%256s \"%64[^\"]\"",local_138,&local_188);
              if (iVar2 == 2) {
                expires = 0x7fffffffffffffff;
                if (local_180 != 100 || local_188 != 0x6574696d696c6e75) {
                  expires = Curl_getdate_capped((char *)&local_188);
                }
                cVar1 = local_138[0];
                pcVar4 = local_138 + (local_138[0] == '.');
                psVar6 = Curl_hsts(h,pcVar4,local_138[0] == '.');
                if (psVar6 == (stsentry *)0x0) {
                  hsts_create(h,pcVar4,cVar1 == '.',expires);
                }
                else {
                  iVar2 = curl_strequal(pcVar4,psVar6->host);
                  if ((iVar2 != 0) && (psVar6->expires < expires)) {
                    psVar6->expires = expires;
                  }
                }
              }
            }
          }
          iVar2 = Curl_get_line(&local_1a8,(FILE *)__stream);
        } while (iVar2 != 0);
      }
      Curl_dyn_free(&local_1a8);
      fclose(__stream);
      CVar3 = CURLE_OK;
    }
  }
  return CVar3;
}

Assistant:

CURLcode Curl_hsts_loadfile(struct Curl_easy *data,
                            struct hsts *h, const char *file)
{
  DEBUGASSERT(h);
  (void)data;
  return hsts_load(h, file);
}